

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_diag_sse2_128_32.c
# Opt level: O2

parasail_result_t *
parasail_nw_table_diag_sse2_128_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  parasail_result_t *ppVar6;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  long lVar7;
  char *pcVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  char *__format;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  int iVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar31;
  int iVar33;
  undefined8 uVar32;
  int iVar34;
  int iVar35;
  uint uVar36;
  int iVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  int iVar45;
  int iVar48;
  int iVar49;
  __m128i_32_t A;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int iVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  __m128i_32_t A_3;
  uint uVar57;
  uint uVar59;
  uint uVar60;
  undefined1 auVar58 [16];
  uint uVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  int32_t *local_128;
  long local_118;
  long local_110;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar8 = "_s2";
  }
  else {
    uVar15 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar8 = "s2Len";
    }
    else if (open < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar8 = "open";
    }
    else if (gap < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar8 = "gap";
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      __format = "%s: missing %s\n";
      pcVar8 = "matrix";
    }
    else {
      if (matrix->type != 0) {
        _s1Len = matrix->length;
LAB_00557a0b:
        iVar9 = -open;
        iVar14 = matrix->min;
        uVar57 = 0x80000000 - iVar14;
        if (iVar14 != iVar9 && SBORROW4(iVar14,iVar9) == iVar14 + open < 0) {
          uVar57 = open | 0x80000000;
        }
        iVar14 = 0x7ffffffe - matrix->max;
        ppVar6 = parasail_result_new_table1(_s1Len,s2Len);
        if (ppVar6 != (parasail_result_t *)0x0) {
          ppVar6->flag = ppVar6->flag | 0x4421001;
          uVar12 = (ulong)(s2Len + 6);
          ptr = parasail_memalign_int32_t(0x10,uVar12);
          ptr_00 = parasail_memalign_int32_t(0x10,uVar12);
          ptr_01 = parasail_memalign_int32_t(0x10,uVar12);
          if (ptr_01 != (int32_t *)0x0 && (ptr_00 != (int32_t *)0x0 && ptr != (int32_t *)0x0)) {
            lVar16 = (long)_s1Len;
            if (matrix->type == 0) {
              local_128 = parasail_memalign_int32_t(0x10,(long)(int)(_s1Len + 3));
              uVar12 = 0;
              if (local_128 == (int32_t *)0x0) {
                return (parasail_result_t *)0x0;
              }
              uVar19 = 0;
              if (0 < _s1Len) {
                uVar19 = (ulong)(uint)_s1Len;
              }
              for (; lVar7 = lVar16, uVar19 != uVar12; uVar12 = uVar12 + 1) {
                local_128[uVar12] = matrix->mapper[(byte)_s1[uVar12]];
              }
              for (; lVar7 < (int)(_s1Len + 3); lVar7 = lVar7 + 1) {
                local_128[lVar7] = 0;
              }
            }
            else {
              local_128 = (int32_t *)0x0;
            }
            uVar21 = s2Len + 3;
            uVar36 = _s1Len - 1;
            iVar37 = s2Len + -1;
            iVar25 = uVar57 + 1;
            auVar44._4_4_ = iVar14;
            auVar44._0_4_ = iVar14;
            auVar44._8_4_ = iVar14;
            auVar44._12_4_ = iVar14;
            auVar64._4_4_ = iVar9 + gap * -2;
            auVar64._0_4_ = gap * -3 - open;
            auVar64._12_4_ = iVar9;
            auVar64._8_4_ = iVar9 - gap;
            piVar2 = matrix->mapper;
            for (uVar12 = 0; uVar15 != uVar12; uVar12 = uVar12 + 1) {
              ptr[uVar12 + 3] = piVar2[(byte)_s2[uVar12]];
            }
            for (lVar7 = 0; uVar12 = uVar15, lVar7 != 3; lVar7 = lVar7 + 1) {
              ptr[lVar7] = 0;
            }
            for (; (int)uVar12 < (int)uVar21; uVar12 = uVar12 + 1) {
              ptr[uVar12 + 3] = 0;
            }
            iVar10 = iVar9;
            for (uVar12 = 0; uVar15 != uVar12; uVar12 = uVar12 + 1) {
              ptr_00[uVar12 + 3] = iVar10;
              ptr_01[uVar12 + 3] = iVar25;
              iVar10 = iVar10 - gap;
            }
            for (lVar7 = 0; uVar12 = uVar15, lVar7 != 3; lVar7 = lVar7 + 1) {
              ptr_00[lVar7] = iVar25;
              ptr_01[lVar7] = iVar25;
            }
            for (; (int)uVar12 < (int)uVar21; uVar12 = uVar12 + 1) {
              ptr_00[uVar12 + 3] = iVar25;
              ptr_01[uVar12 + 3] = iVar25;
            }
            ptr_00[2] = 0;
            auVar4._4_4_ = iVar25;
            auVar4._0_4_ = iVar25;
            auVar4._8_4_ = iVar25;
            auVar4._12_4_ = iVar25;
            local_110 = 0;
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            local_118 = uVar15 * 0xc + -0xc;
            uVar57 = 3;
            uVar59 = 2;
            uVar60 = 1;
            uVar61 = 0;
            uVar12 = 0;
            auVar51 = auVar4;
            auVar29 = auVar4;
            while ((long)uVar12 < lVar16) {
              uVar19 = uVar12 | 3;
              uVar24 = (uint)uVar12;
              if (matrix->type == 0) {
                uVar20 = local_128[uVar12 + 1];
                uVar11 = local_128[uVar12 + 2];
                uVar22 = local_128[uVar12];
                uVar18 = local_128[uVar19];
              }
              else {
                uVar20 = uVar36;
                if ((long)(uVar12 | 1) < lVar16) {
                  uVar20 = uVar24 | 1;
                }
                uVar11 = uVar24 | 2;
                if (lVar16 <= (long)(uVar12 | 2)) {
                  uVar11 = uVar36;
                }
                uVar22 = uVar24;
                uVar18 = uVar24 | 3;
                if (lVar16 <= (long)uVar19) {
                  uVar18 = uVar36;
                }
              }
              uVar23 = uVar12 | 1;
              uVar17 = uVar12 | 2;
              piVar2 = matrix->matrix;
              iVar10 = matrix->size;
              auVar41._0_12_ = auVar4._4_12_;
              auVar41._12_4_ = ptr_00[2];
              auVar46._12_4_ = iVar9 - uVar24 * gap;
              auVar46._0_12_ = auVar41._0_12_;
              uVar12 = uVar12 + 4;
              ptr_00[2] = iVar9 - (int)uVar12 * gap;
              auVar58._0_4_ = -(uint)(uVar57 == uVar36);
              auVar58._4_4_ = -(uint)(uVar59 == uVar36);
              auVar58._8_4_ = -(uint)(uVar60 == uVar36);
              auVar58._12_4_ = -(uint)(uVar61 == uVar36);
              auVar39._4_4_ = iVar25;
              auVar39._0_4_ = iVar25;
              auVar39._8_4_ = iVar25;
              auVar39._12_4_ = iVar25;
              iVar31 = -3;
              iVar33 = -2;
              iVar34 = -1;
              iVar35 = 0;
              auVar27 = auVar39;
              for (uVar13 = 0; uVar21 != uVar13; uVar13 = uVar13 + 1) {
                iVar1 = ptr_00[uVar13 + 3];
                auVar53._0_4_ = auVar46._4_4_ - open;
                auVar53._4_4_ = auVar46._8_4_ - open;
                auVar53._8_4_ = auVar46._12_4_ - open;
                auVar53._12_4_ = iVar1 - open;
                auVar62._0_4_ = auVar27._4_4_ - gap;
                auVar62._4_4_ = auVar27._8_4_ - gap;
                auVar62._8_4_ = auVar27._12_4_ - gap;
                auVar62._12_4_ = ptr_01[uVar13 + 3] - gap;
                auVar27._0_4_ = -(uint)(auVar62._0_4_ < auVar53._0_4_);
                auVar27._4_4_ = -(uint)(auVar62._4_4_ < auVar53._4_4_);
                auVar27._8_4_ = -(uint)(auVar62._8_4_ < auVar53._8_4_);
                auVar27._12_4_ = -(uint)(auVar62._12_4_ < auVar53._12_4_);
                auVar27 = ~auVar27 & auVar62 | auVar53 & auVar27;
                auVar55._0_4_ = auVar46._0_4_ - open;
                auVar55._4_4_ = auVar46._4_4_ - open;
                auVar55._8_4_ = auVar46._8_4_ - open;
                auVar55._12_4_ = auVar46._12_4_ - open;
                auVar47._0_4_ = auVar39._0_4_ - gap;
                auVar47._4_4_ = auVar39._4_4_ - gap;
                auVar47._8_4_ = auVar39._8_4_ - gap;
                auVar47._12_4_ = auVar39._12_4_ - gap;
                auVar54._0_4_ = -(uint)(auVar47._0_4_ < auVar55._0_4_);
                auVar54._4_4_ = -(uint)(auVar47._4_4_ < auVar55._4_4_);
                auVar54._8_4_ = -(uint)(auVar47._8_4_ < auVar55._8_4_);
                auVar54._12_4_ = -(uint)(auVar47._12_4_ < auVar55._12_4_);
                auVar55 = ~auVar54 & auVar47 | auVar55 & auVar54;
                auVar63._0_4_ =
                     piVar2[(long)(int)(uVar18 * iVar10) + (long)ptr[uVar13]] + auVar41._0_4_;
                auVar63._4_4_ =
                     piVar2[(long)(int)(uVar11 * iVar10) + (long)ptr[uVar13 + 1]] + auVar41._4_4_;
                auVar63._8_4_ =
                     piVar2[(long)(int)(uVar20 * iVar10) + (long)ptr[uVar13 + 2]] + auVar41._8_4_;
                auVar63._12_4_ =
                     piVar2[(long)(int)(uVar22 * iVar10) + (long)ptr[uVar13 + 3]] + auVar41._12_4_;
                auVar38._0_4_ = -(uint)(auVar55._0_4_ < auVar63._0_4_);
                auVar38._4_4_ = -(uint)(auVar55._4_4_ < auVar63._4_4_);
                auVar38._8_4_ = -(uint)(auVar55._8_4_ < auVar63._8_4_);
                auVar38._12_4_ = -(uint)(auVar55._12_4_ < auVar63._12_4_);
                auVar39 = ~auVar38 & auVar55 | auVar63 & auVar38;
                auVar42._0_4_ = -(uint)(auVar27._0_4_ < auVar39._0_4_);
                auVar42._4_4_ = -(uint)(auVar27._4_4_ < auVar39._4_4_);
                auVar42._8_4_ = -(uint)(auVar27._8_4_ < auVar39._8_4_);
                auVar42._12_4_ = -(uint)(auVar27._12_4_ < auVar39._12_4_);
                auVar40._0_4_ = -(uint)(iVar31 == -1);
                auVar40._4_4_ = -(uint)(iVar33 == -1);
                auVar40._8_4_ = -(uint)(iVar34 == -1);
                auVar40._12_4_ = -(uint)(iVar35 == -1);
                auVar47 = auVar64 & auVar40 | ~auVar40 & (~auVar42 & auVar27 | auVar39 & auVar42);
                iVar45 = auVar47._0_4_;
                iVar48 = auVar47._4_4_;
                iVar49 = auVar47._8_4_;
                iVar50 = auVar47._12_4_;
                if (3 < uVar13) {
                  auVar43._0_4_ = -(uint)(iVar45 < auVar44._0_4_);
                  auVar43._4_4_ = -(uint)(iVar48 < auVar44._4_4_);
                  auVar43._8_4_ = -(uint)(iVar49 < auVar44._8_4_);
                  auVar43._12_4_ = -(uint)(iVar50 < auVar44._12_4_);
                  auVar44 = ~auVar43 & auVar44 | auVar47 & auVar43;
                  auVar56._0_4_ = -(uint)(iVar45 < auVar51._0_4_);
                  auVar56._4_4_ = -(uint)(iVar48 < auVar51._4_4_);
                  auVar56._8_4_ = -(uint)(iVar49 < auVar51._8_4_);
                  auVar56._12_4_ = -(uint)(iVar50 < auVar51._12_4_);
                  auVar51 = auVar51 & auVar56 | ~auVar56 & auVar47;
                }
                piVar3 = ((ppVar6->field_4).rowcols)->score_row;
                if (uVar13 < uVar15) {
                  *(int *)((long)piVar3 + uVar13 * 4 + local_110) = iVar50;
                }
                if (uVar13 - 1 < uVar15 && (long)uVar23 < lVar16) {
                  *(int *)((long)piVar3 + uVar13 * 4 + uVar15 * 4 * uVar23 + -4) = iVar49;
                }
                if (((long)uVar17 < lVar16) && ((long)(uVar13 - 2) < (long)uVar15 && 1 < uVar13)) {
                  *(int *)((long)piVar3 + uVar13 * 4 + uVar15 * 4 * uVar17 + -8) = iVar48;
                }
                if (2 < uVar13 && (long)uVar19 < lVar16) {
                  *(int *)((long)piVar3 + uVar13 * 4 + local_118) = iVar45;
                }
                auVar5._4_4_ = iVar25;
                auVar5._0_4_ = iVar25;
                auVar5._8_4_ = iVar25;
                auVar5._12_4_ = iVar25;
                auVar27 = ~auVar40 & auVar27 | auVar5 & auVar40;
                auVar39 = ~auVar40 & auVar55 | auVar5 & auVar40;
                ptr_00[uVar13] = iVar45;
                ptr_01[uVar13] = auVar27._0_4_;
                auVar28._0_4_ = -(uint)(iVar31 == iVar37);
                auVar28._4_4_ = -(uint)(iVar33 == iVar37);
                auVar28._8_4_ = -(uint)(iVar34 == iVar37);
                auVar28._12_4_ = -(uint)(iVar35 == iVar37);
                auVar29 = ~(auVar28 & auVar58) & auVar29 | auVar47 & auVar28 & auVar58;
                iVar31 = iVar31 + 1;
                iVar33 = iVar33 + 1;
                iVar34 = iVar34 + 1;
                iVar35 = iVar35 + 1;
                auVar41._0_12_ = auVar46._4_12_;
                auVar41._12_4_ = iVar1;
                auVar46 = auVar47;
              }
              uVar57 = uVar57 + 4;
              uVar59 = uVar59 + 4;
              uVar60 = uVar60 + 4;
              uVar61 = uVar61 + 4;
              auVar65._0_4_ = auVar64._0_4_ + gap * -4;
              auVar65._4_4_ = auVar64._4_4_ + gap * -4;
              auVar65._8_4_ = auVar64._8_4_ + gap * -4;
              auVar65._12_4_ = auVar64._12_4_ + gap * -4;
              local_118 = local_118 + uVar15 * 0x10;
              local_110 = local_110 + uVar15 * 0x10;
              auVar64 = auVar65;
            }
            iVar9 = 4;
            uVar32 = CONCAT44(iVar37,uVar36);
            iVar37 = iVar25;
            while (bVar26 = iVar9 != 0, iVar9 = iVar9 + -1, bVar26) {
              if (iVar37 < auVar29._12_4_) {
                iVar37 = auVar29._12_4_;
              }
              lVar16 = auVar29._8_8_;
              uVar15 = auVar29._0_8_;
              auVar29._0_8_ = uVar15 << 0x20;
              auVar29._8_8_ = lVar16 << 0x20 | uVar15 >> 0x20;
            }
            auVar30._0_4_ = -(uint)(auVar44._0_4_ < iVar25);
            auVar30._4_4_ = -(uint)(auVar44._4_4_ < iVar25);
            auVar30._8_4_ = -(uint)(auVar44._8_4_ < iVar25);
            auVar30._12_4_ = -(uint)(auVar44._12_4_ < iVar25);
            auVar52._0_4_ = -(uint)(iVar14 < auVar51._0_4_);
            auVar52._4_4_ = -(uint)(iVar14 < auVar51._4_4_);
            auVar52._8_4_ = -(uint)(iVar14 < auVar51._8_4_);
            auVar52._12_4_ = -(uint)(iVar14 < auVar51._12_4_);
            iVar14 = movmskps(iVar9,auVar52 | auVar30);
            if (iVar14 != 0) {
              *(byte *)&ppVar6->flag = (byte)ppVar6->flag | 0x40;
              uVar32 = 0;
              iVar37 = 0;
            }
            ppVar6->score = iVar37;
            ppVar6->end_query = (int)uVar32;
            ppVar6->end_ref = (int)((ulong)uVar32 >> 0x20);
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            if (matrix->type == 0) {
              parasail_free(local_128);
              return ppVar6;
            }
            return ppVar6;
          }
        }
        return (parasail_result_t *)0x0;
      }
      if (_s1 == (char *)0x0) {
        __format = "%s: missing %s\n";
        pcVar8 = "_s1";
      }
      else {
        if (0 < _s1Len) goto LAB_00557a0b;
        __format = "%s: %s must be > 0\n";
        pcVar8 = "_s1Len";
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_table_diag_sse2_128_32",pcVar8);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMax;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi32(NEG_LIMIT);
    vOpen = _mm_set1_epi32(open);
    vGap  = _mm_set1_epi32(gap);
    vOne = _mm_set1_epi32(1);
    vN = _mm_set1_epi32(N);
    vGapN = _mm_set1_epi32(gap*N);
    vNegOne = _mm_set1_epi32(-1);
    vI = _mm_set_epi32(0,1,2,3);
    vJreset = _mm_set_epi32(0,-1,-2,-3);
    vMax = vNegInf;
    vILimit = _mm_set1_epi32(s1Len);
    vILimit1 = _mm_sub_epi32(vILimit, vOne);
    vJLimit = _mm_set1_epi32(s2Len);
    vJLimit1 = _mm_sub_epi32(vJLimit, vOne);
    vIBoundary = _mm_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        vNH = _mm_srli_si128(vNH, 4);
        vNH = _mm_insert_epi32_rpl(vNH, H_pr[-1], 3);
        vWH = _mm_srli_si128(vWH, 4);
        vWH = _mm_insert_epi32_rpl(vWH, -open - i*gap, 3);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 4);
            vNH = _mm_insert_epi32_rpl(vNH, H_pr[j], 3);
            vF = _mm_srli_si128(vF, 4);
            vF = _mm_insert_epi32_rpl(vF, F_pr[j], 3);
            vF = _mm_max_epi32_rpl(
                    _mm_sub_epi32(vNH, vOpen),
                    _mm_sub_epi32(vF, vGap));
            vE = _mm_max_epi32_rpl(
                    _mm_sub_epi32(vWH, vOpen),
                    _mm_sub_epi32(vE, vGap));
            vMat = _mm_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm_add_epi32(vNWH, vMat);
            vWH = _mm_max_epi32_rpl(vNWH, vE);
            vWH = _mm_max_epi32_rpl(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm_blendv_epi8_rpl(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int32_t)_mm_extract_epi32_rpl(vWH,0);
            F_pr[j-3] = (int32_t)_mm_extract_epi32_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m128i cond_valid_I = _mm_cmpeq_epi32(vI, vILimit1);
                __m128i cond_valid_J = _mm_cmpeq_epi32(vJ, vJLimit1);
                __m128i cond_all = _mm_and_si128(cond_valid_I, cond_valid_J);
                vMax = _mm_blendv_epi8_rpl(vMax, vWH, cond_all);
            }
            vJ = _mm_add_epi32(vJ, vOne);
        }
        vI = _mm_add_epi32(vI, vN);
        vIBoundary = _mm_sub_epi32(vIBoundary, vGapN);
    }

    /* max in vMax */
    for (i=0; i<N; ++i) {
        int32_t value;
        value = (int32_t) _mm_extract_epi32_rpl(vMax, 3);
        if (value > score) {
            score = value;
        }
        vMax = _mm_slli_si128(vMax, 4);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}